

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_ulong.c
# Opt level: O0

uint fmt_ulong(char *s,unsigned_long u)

{
  undefined1 auVar1 [16];
  ulong local_28;
  unsigned_long q;
  unsigned_long uStack_18;
  uint len;
  unsigned_long u_local;
  char *s_local;
  
  q._4_4_ = 1;
  for (local_28 = u; 9 < local_28; local_28 = local_28 / 10) {
    q._4_4_ = q._4_4_ + 1;
  }
  if (s != (char *)0x0) {
    uStack_18 = u;
    u_local = (unsigned_long)(s + q._4_4_);
    do {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uStack_18;
      *(char *)(u_local - 1) = SUB161(auVar1 % ZEXT816(10),0) + '0';
      uStack_18 = uStack_18 / 10;
      u_local = u_local - 1;
    } while (uStack_18 != 0);
  }
  return q._4_4_;
}

Assistant:

unsigned int fmt_ulong(register char *s,register unsigned long u)
{
  register unsigned int len; register unsigned long q;
  len = 1; q = u;
  while (q > 9) { ++len; q /= 10; }
  if (s) {
    s += len;
    do { *--s = '0' + (u % 10); u /= 10; } while(u); /* handles u == 0 */
  }
  return len;
}